

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_dns_name.c
# Opt level: O2

ares_buf_t * ares_dns_labels_add(ares_array_t *labels)

{
  ares_status_t aVar1;
  ares_buf_t *paVar2;
  ares_buf_t **buf;
  long *local_10;
  
  aVar1 = ares_array_insert_last(&local_10,labels);
  if (aVar1 == ARES_SUCCESS) {
    paVar2 = ares_buf_create();
    *local_10 = (long)paVar2;
    if ((ares_buf_t *)*local_10 != (ares_buf_t *)0x0) {
      return (ares_buf_t *)*local_10;
    }
    ares_array_remove_last(labels);
  }
  return (ares_buf_t *)0x0;
}

Assistant:

static ares_buf_t *ares_dns_labels_add(ares_array_t *labels)
{
  ares_buf_t **buf;

  if (labels == NULL) {
    return NULL; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  if (ares_array_insert_last((void **)&buf, labels) != ARES_SUCCESS) {
    return NULL;
  }

  *buf = ares_buf_create();
  if (*buf == NULL) {
    ares_array_remove_last(labels);
    return NULL;
  }

  return *buf;
}